

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O2

FieldType icu_63::GMTOffsetField::getTypeByLetter(UChar ch)

{
  FieldType FVar1;
  undefined2 in_register_0000003a;
  int iVar2;
  
  iVar2 = CONCAT22(in_register_0000003a,ch);
  if (iVar2 == 0x48) {
    FVar1 = HOUR;
  }
  else if (iVar2 == 0x73) {
    FVar1 = SECOND;
  }
  else {
    if (iVar2 != 0x6d) {
      return TEXT;
    }
    FVar1 = MINUTE;
  }
  return FVar1;
}

Assistant:

GMTOffsetField::FieldType
GMTOffsetField::getTypeByLetter(UChar ch) {
    if (ch == 0x0048 /* H */) {
        return HOUR;
    } else if (ch == 0x006D /* m */) {
        return MINUTE;
    } else if (ch == 0x0073 /* s */) {
        return SECOND;
    }
    return TEXT;
}